

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::compute::anon_unknown_0::CopyImageToSSBOTestInstance::iterate
          (TestStatus *__return_storage_ptr__,CopyImageToSSBOTestInstance *this)

{
  VkAllocationCallbacks **ppVVar1;
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  RefData<vk::Handle<(vk::HandleType)13>_> data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  RefData<vk::Handle<(vk::HandleType)14>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)18>_> data_05;
  RefData<vk::Handle<(vk::HandleType)24>_> data_06;
  RefData<vk::VkCommandBuffer_s_*> data_07;
  deUint32 queueFamilyIndex_00;
  uint uVar4;
  deUint32 dVar5;
  uint uVar6;
  uint uVar7;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  VkImage *pVVar8;
  Allocation *pAVar9;
  VkDeviceSize VVar10;
  DescriptorSetLayoutBuilder *pDVar11;
  DescriptorPoolBuilder *pDVar12;
  Handle<(vk::HandleType)21> *pHVar13;
  Handle<(vk::HandleType)19> *pHVar14;
  Handle<(vk::HandleType)13> *pHVar15;
  VkBuffer *pVVar16;
  Handle<(vk::HandleType)22> *pHVar17;
  DescriptorSetUpdateBuilder *pDVar18;
  ProgramCollection<vk::ProgramBinary> *this_00;
  ProgramBinary *binary;
  Handle<(vk::HandleType)16> *pHVar19;
  Handle<(vk::HandleType)14> *pHVar20;
  Handle<(vk::HandleType)24> *pHVar21;
  VkCommandBuffer_s **ppVVar22;
  Handle<(vk::HandleType)18> *pHVar23;
  VkDeviceMemory memory;
  void *pvVar24;
  void *pvVar25;
  ostream *poVar26;
  allocator<char> local_ab1;
  string local_ab0;
  undefined4 local_a8c;
  string local_a88;
  ostringstream local_a68 [8];
  ostringstream msg;
  deUint32 ref;
  deUint32 res;
  deUint32 ndx;
  deUint32 *refBufferPtr;
  deUint32 *bufferPtr;
  Allocation *outputBufferAllocation;
  Move<vk::VkCommandBuffer_s_*> local_898;
  RefData<vk::VkCommandBuffer_s_*> local_878;
  undefined1 local_858 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_818;
  undefined1 local_7f8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  IVec2 workSize;
  VkBufferImageCopy copyParams;
  undefined1 local_790 [8];
  VkBufferMemoryBarrier computeFinishBarrier;
  undefined1 local_730 [8];
  VkImageMemoryBarrier imagePostCopyBarrier;
  undefined1 local_6c0 [8];
  VkImageMemoryBarrier imagePreCopyBarrier;
  undefined1 local_670 [8];
  VkBufferMemoryBarrier stagingBufferPostHostWriteBarrier;
  Move<vk::Handle<(vk::HandleType)18>_> local_628;
  RefData<vk::Handle<(vk::HandleType)18>_> local_608;
  undefined1 local_5e8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_5c0;
  RefData<vk::Handle<(vk::HandleType)16>_> local_5a0;
  undefined1 local_580 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  string local_558;
  Move<vk::Handle<(vk::HandleType)14>_> local_538;
  RefData<vk::Handle<(vk::HandleType)14>_> local_518;
  undefined1 local_4f8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  Location local_4c8;
  VkDescriptorSet local_4c0;
  DescriptorSetUpdateBuilder local_4b8;
  deUint64 local_470;
  undefined1 local_468 [8];
  VkDescriptorBufferInfo bufferDescriptorInfo;
  VkSampler local_448;
  undefined1 local_440 [8];
  VkDescriptorImageInfo imageDescriptorInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_418;
  RefData<vk::Handle<(vk::HandleType)22>_> local_3f8;
  undefined1 local_3d8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_3a0;
  RefData<vk::Handle<(vk::HandleType)21>_> local_380;
  undefined1 local_360 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_2f8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_2d8;
  undefined1 local_2b8 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_290;
  undefined1 local_258 [8];
  Buffer outputBuffer;
  uint local_21c;
  deUint32 *pdStack_218;
  deUint32 i;
  deUint32 *bufferPtr_1;
  Allocation *stagingBufferAllocation;
  Random rnd;
  undefined1 local_1b8 [8];
  Buffer stagingBuffer;
  VkDeviceSize bufferSizeBytes;
  deUint32 imageArea;
  Move<vk::Handle<(vk::HandleType)13>_> local_150;
  RefData<vk::Handle<(vk::HandleType)13>_> local_130;
  undefined1 local_110 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> imageView;
  undefined1 auStack_e0 [8];
  VkImageSubresourceRange subresourceRange;
  Image image;
  VkImageCreateInfo imageParams;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  CopyImageToSSBOTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ppVVar1 = &image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  make2DImageCreateInfo((VkImageCreateInfo *)ppVVar1,&this->m_imageSize,10);
  subresourceRange.baseArrayLayer = ::vk::MemoryRequirement::Any.m_flags;
  compute::Image::Image
            ((Image *)&subresourceRange.layerCount,vk_00,device_00,allocator_00,
             (VkImageCreateInfo *)ppVVar1,::vk::MemoryRequirement::Any);
  ::vk::makeImageSubresourceRange((VkImageSubresourceRange *)auStack_e0,1,0,1,0,1);
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  subresourceRange_00.levelCount = subresourceRange.aspectMask;
  subresourceRange_00.aspectMask = auStack_e0._0_4_;
  subresourceRange_00.baseMipLevel = auStack_e0._4_4_;
  subresourceRange_00.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = subresourceRange.levelCount;
  makeImageView(&local_150,vk_00,device_00,(VkImage)pVVar8->m_internal,VK_IMAGE_VIEW_TYPE_2D,
                VK_FORMAT_R32_UINT,subresourceRange_00);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_130,(Move *)&local_150);
  data.deleter.m_deviceIface._0_4_ = (int)local_130.deleter.m_deviceIface;
  data.object.m_internal = local_130.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_130.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_130.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_130.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_130.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_130.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_110,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_150);
  uVar4 = compute::(anonymous_namespace)::multiplyComponents<int,2>(&this->m_imageSize);
  stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)((ulong)uVar4 << 2);
  makeBufferCreateInfo
            ((VkBufferCreateInfo *)&rnd.m_rnd.w,
             (VkDeviceSize)
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,1);
  rnd.m_rnd.z = ::vk::MemoryRequirement::HostVisible.m_flags;
  compute::Buffer::Buffer
            ((Buffer *)local_1b8,vk_00,device_00,allocator_00,(VkBufferCreateInfo *)&rnd.m_rnd.w,
             ::vk::MemoryRequirement::HostVisible);
  de::Random::Random((Random *)((long)&stagingBufferAllocation + 4),0xab2c7);
  pAVar9 = compute::Buffer::getAllocation((Buffer *)local_1b8);
  pdStack_218 = (deUint32 *)::vk::Allocation::getHostPtr(pAVar9);
  for (local_21c = 0; local_21c < uVar4; local_21c = local_21c + 1) {
    dVar5 = de::Random::getUint32((Random *)((long)&stagingBufferAllocation + 4));
    *pdStack_218 = dVar5;
    pdStack_218 = pdStack_218 + 1;
  }
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar9);
  VVar10 = ::vk::Allocation::getOffset(pAVar9);
  ::vk::flushMappedMemoryRange
            (vk_00,device_00,
             (VkDeviceMemory)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,VVar10,
             (VkDeviceSize)
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  de::Random::~Random((Random *)((long)&stagingBufferAllocation + 4));
  makeBufferCreateInfo
            (&local_290,
             (VkDeviceSize)
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,0x20);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  compute::Buffer::Buffer
            ((Buffer *)local_258,vk_00,device_00,allocator_00,&local_290,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  pDVar11 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  pDVar11 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar11,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_2f8,pDVar11,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d8,(Move *)&local_2f8);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_2d8.deleter.m_deviceIface;
  data_00.object.m_internal = local_2d8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2d8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_2d8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_2d8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_2d8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_2d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2b8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_2f8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pDVar12 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar12 = ::vk::DescriptorPoolBuilder::addType(pDVar12,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build(&local_3a0,pDVar12,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_380,(Move *)&local_3a0);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_380.deleter.m_deviceIface;
  data_01.object.m_internal = local_380.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_380.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_380.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_380.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_380.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_380.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_360,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_3a0);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_360);
  descriptorPool_00.m_internal = pHVar13->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2b8);
  imageDescriptorInfo._16_8_ = pHVar14->m_internal;
  makeDescriptorSet(&local_418,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)imageDescriptorInfo._16_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3f8,(Move *)&local_418);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_3f8.deleter.m_deviceIface;
  data_02.object.m_internal = local_3f8.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3f8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_3f8.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_3f8.deleter.m_device >> 0x20);
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_3f8.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_3f8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3d8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_418);
  ::vk::Handle<(vk::HandleType)20>::Handle(&local_448,0);
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_110);
  bufferDescriptorInfo.range = pHVar15->m_internal;
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_440,local_448,(VkImageView)bufferDescriptorInfo.range,
             VK_IMAGE_LAYOUT_GENERAL);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_258);
  local_470 = pVVar16->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_468,(VkBuffer)local_470,0,
             (VkDeviceSize)
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_4b8);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3d8);
  local_4c0.m_internal = pHVar17->m_internal;
  local_4c8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_4b8,local_4c0,&local_4c8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_468);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3d8);
  destSet.m_internal = pHVar17->m_internal;
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar18,destSet,
                       (Location *)
                       &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       (VkDescriptorImageInfo *)local_440);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar18,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_4b8);
  this_00 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"comp",
             (allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_558);
  ::vk::createShaderModule(&local_538,vk_00,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_518,(Move *)&local_538);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_518.deleter.m_deviceIface;
  data_03.object.m_internal = local_518.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_518.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_518.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_518.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_518.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_518.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_4f8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_538);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2b8);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar14->m_internal;
  makePipelineLayout(&local_5c0,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5a0,(Move *)&local_5c0);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_5a0.deleter.m_deviceIface;
  data_04.object.m_internal = local_5a0.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5a0.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_5a0.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_5a0.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_5a0.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_5a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_580,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_5c0);
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_580);
  pipelineLayout_00.m_internal = pHVar19->m_internal;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_4f8);
  stagingBufferPostHostWriteBarrier.size = pHVar20->m_internal;
  makeComputePipeline(&local_628,vk_00,device_00,pipelineLayout_00,
                      (VkShaderModule)stagingBufferPostHostWriteBarrier.size);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_608,(Move *)&local_628);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_608.deleter.m_deviceIface;
  data_05.object.m_internal = local_608.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_608.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_608.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_608.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_608.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_608.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5e8,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_628);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_1b8);
  imagePreCopyBarrier._64_8_ = pVVar16->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_670,0x4000,0x800,(VkBuffer)imagePreCopyBarrier._64_8_,0,
             (VkDeviceSize)
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  imagePostCopyBarrier._64_8_ = auStack_e0;
  subresourceRange_01.levelCount = subresourceRange.aspectMask;
  subresourceRange_01.aspectMask = auStack_e0._0_4_;
  subresourceRange_01.baseMipLevel = auStack_e0._4_4_;
  subresourceRange_01.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_01.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_6c0,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,(VkImage)pVVar8->m_internal,subresourceRange_01);
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  computeFinishBarrier.size = (VkDeviceSize)auStack_e0;
  subresourceRange_02.levelCount = subresourceRange.aspectMask;
  subresourceRange_02.aspectMask = auStack_e0._0_4_;
  subresourceRange_02.baseMipLevel = auStack_e0._4_4_;
  subresourceRange_02.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_02.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_730,0x1000,0x20,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,(VkImage)pVVar8->m_internal,subresourceRange_02);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_258);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_790,0x40,0x2000,(VkBuffer)pVVar16->m_internal,0,
             (VkDeviceSize)
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  makeBufferImageCopy((VkBufferImageCopy *)&workSize,&this->m_imageSize);
  tcu::operator/((tcu *)&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                         m_allocator,&this->m_imageSize,&this->m_localSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,queueFamilyIndex_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_818,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_818.deleter.m_deviceIface;
  data_06.object.m_internal = local_818.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_818.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_818.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_818.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_818.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_818.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_7f8,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_7f8);
  ::vk::allocateCommandBuffer
            (&local_898,vk_00,device_00,(VkCommandPool)pHVar21->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_878,(Move *)&local_898);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_878.deleter.m_deviceIface;
  data_07.object = local_878.object;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_878.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_878.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_878.deleter.m_device >> 0x20);
  data_07.deleter.m_pool.m_internal._0_4_ = (int)local_878.deleter.m_pool.m_internal;
  data_07.deleter.m_pool.m_internal._4_4_ = (int)(local_878.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_858,data_07);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_898);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_858);
  beginCommandBuffer(vk_00,*ppVVar22);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_858);
  pVVar2 = *ppVVar22;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_5e8);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,1,pHVar23->m_internal);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_858);
  pVVar2 = *ppVVar22;
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_580);
  dVar3 = pHVar19->m_internal;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3d8);
  (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar2,1,dVar3,0,1,pHVar17,0,0);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_858);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar22,0x4000,0x1000,0,0,0,1,(int)local_670,1,local_6c0);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_858);
  pVVar2 = *ppVVar22;
  pVVar16 = compute::Buffer::operator*((Buffer *)local_1b8);
  dVar3 = pVVar16->m_internal;
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  (*vk_00->_vptr_DeviceInterface[0x62])(vk_00,pVVar2,dVar3,pVVar8->m_internal,7,1,&workSize);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_858);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar22,0x1000,1,0,0,0,0,0,1,local_730);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_858);
  pVVar2 = *ppVVar22;
  ppVVar1 = &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  uVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)ppVVar1);
  uVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)ppVVar1);
  (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar2,(ulong)uVar6,(ulong)uVar7,1);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_858);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar22,0x800,0x4000,0,0,0,1,(int)local_790,0,0);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_858);
  endCommandBuffer(vk_00,*ppVVar22);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_858);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar22);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_858);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_7f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_580);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_4f8);
  pAVar9 = compute::Buffer::getAllocation((Buffer *)local_258);
  memory = ::vk::Allocation::getMemory(pAVar9);
  VVar10 = ::vk::Allocation::getOffset(pAVar9);
  ::vk::invalidateMappedMemoryRange
            (vk_00,device_00,memory,VVar10,
             (VkDeviceSize)
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pvVar24 = ::vk::Allocation::getHostPtr(pAVar9);
  pAVar9 = compute::Buffer::getAllocation((Buffer *)local_1b8);
  pvVar25 = ::vk::Allocation::getHostPtr(pAVar9);
  ref = 0;
  do {
    if (uVar4 <= ref) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ab0,"Compute succeeded",&local_ab1);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_ab0);
      std::__cxx11::string::~string((string *)&local_ab0);
      std::allocator<char>::~allocator(&local_ab1);
      local_a8c = 1;
LAB_00cf4385:
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3d8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_360);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2b8);
      compute::Buffer::~Buffer((Buffer *)local_258);
      compute::Buffer::~Buffer((Buffer *)local_1b8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_110);
      compute::Image::~Image((Image *)&subresourceRange.layerCount);
      return __return_storage_ptr__;
    }
    if (*(int *)((long)pvVar24 + (ulong)ref * 4) != *(int *)((long)pvVar25 + (ulong)ref * 4)) {
      std::__cxx11::ostringstream::ostringstream(local_a68);
      poVar26 = std::operator<<((ostream *)local_a68,"Comparison failed for Output.values[");
      poVar26 = (ostream *)std::ostream::operator<<(poVar26,ref);
      std::operator<<(poVar26,"]");
      std::__cxx11::ostringstream::str();
      tcu::TestStatus::fail(__return_storage_ptr__,&local_a88);
      std::__cxx11::string::~string((string *)&local_a88);
      local_a8c = 1;
      std::__cxx11::ostringstream::~ostringstream(local_a68);
      goto LAB_00cf4385;
    }
    ref = ref + 1;
  } while( true );
}

Assistant:

tcu::TestStatus CopyImageToSSBOTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create an image

	const VkImageCreateInfo imageParams = make2DImageCreateInfo(m_imageSize, VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_STORAGE_BIT);
	const Image image(vk, device, allocator, imageParams, MemoryRequirement::Any);

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView> imageView(makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R32_UINT, subresourceRange));

	// Staging buffer (source data for image)

	const deUint32 imageArea = multiplyComponents(m_imageSize);
	const VkDeviceSize bufferSizeBytes = sizeof(deUint32) * imageArea;

	const Buffer stagingBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT), MemoryRequirement::HostVisible);

	// Populate the staging buffer with test data
	{
		de::Random rnd(0xab2c7);
		const Allocation& stagingBufferAllocation = stagingBuffer.getAllocation();
		deUint32* bufferPtr = static_cast<deUint32*>(stagingBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < imageArea; ++i)
			*bufferPtr++ = rnd.getUint32();

		flushMappedMemoryRange(vk, device, stagingBufferAllocation.getMemory(), stagingBufferAllocation.getOffset(), bufferSizeBytes);
	}

	// Create a buffer to store shader output

	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	// Set the bindings

	const VkDescriptorImageInfo imageDescriptorInfo = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*outputBuffer, 0ull, bufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &bufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageDescriptorInfo)
		.update(vk, device);

	// Perform the computation
	{
		const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
		const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
		const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		const VkBufferMemoryBarrier stagingBufferPostHostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT, *stagingBuffer, 0ull, bufferSizeBytes);

		const VkImageMemoryBarrier imagePreCopyBarrier = makeImageMemoryBarrier(
			0u, VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			*image, subresourceRange);

		const VkImageMemoryBarrier imagePostCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL,
			*image, subresourceRange);

		const VkBufferMemoryBarrier computeFinishBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, bufferSizeBytes);

		const VkBufferImageCopy copyParams = makeBufferImageCopy(m_imageSize);
		const tcu::IVec2 workSize = m_imageSize / m_localSize;

		// Prepare the command buffer

		const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
		const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		// Start recording commands

		beginCommandBuffer(vk, *cmdBuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &stagingBufferPostHostWriteBarrier, 1, &imagePreCopyBarrier);
		vk.cmdCopyBufferToImage(*cmdBuffer, *stagingBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &copyParams);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imagePostCopyBarrier);

		vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), 1u);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &computeFinishBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

		endCommandBuffer(vk, *cmdBuffer);

		// Wait for completion

		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), bufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32* refBufferPtr = static_cast<deUint32*>(stagingBuffer.getAllocation().getHostPtr());

	for (deUint32 ndx = 0; ndx < imageArea; ++ndx)
	{
		const deUint32 res = *(bufferPtr + ndx);
		const deUint32 ref = *(refBufferPtr + ndx);

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for Output.values[" << ndx << "]";
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}